

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syncprod.cc
# Opt level: O2

dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *
tchecker::syncprod::committed_processes
          (dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          system_t *system,const_vloc_sptr_t *vloc)

{
  uint uVar1;
  bool bVar2;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar3;
  long lVar4;
  reference rVar5;
  pointer local_40;
  
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (__return_storage_ptr__,
             ((long)(system->super_system_t).super_processes_t._procs_attributes.
                    super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(system->super_system_t).super_processes_t._procs_attributes.
                   super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0x38,0,
             (allocator<unsigned_long> *)&stack0xffffffffffffffc0);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::reset
            (__return_storage_ptr__);
  pmVar3 = intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>
           ::operator*(vloc);
  uVar1 = (pmVar3->super_vloc_t).super_loc_array_t.super_vloc_base_t.
          super_array_capacity_t<unsigned_int>._capacity;
  for (lVar4 = 0; (ulong)uVar1 << 2 != lVar4; lVar4 = lVar4 + 4) {
    bVar2 = system_t::is_committed
                      (system,*(loc_id_t *)
                               (&(pmVar3->super_vloc_t).super_loc_array_t._fam.field_0x0 + lVar4));
    if (bVar2) {
      tchecker::system::locs_t::location((locs_t *)&stack0xffffffffffffffc0,(int)system + 0x230);
      rVar5 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        (__return_storage_ptr__,
                         (ulong)*(uint *)&(local_40->
                                          super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr);
      *rVar5.m_block = *rVar5.m_block | rVar5.m_mask;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

boost::dynamic_bitset<> committed_processes(tchecker::syncprod::system_t const & system,
                                            tchecker::const_vloc_sptr_t const & vloc)
{
  boost::dynamic_bitset<> committed(system.processes_count());
  committed.reset();
  for (tchecker::loc_id_t id : *vloc)
    if (system.is_committed(id))
      committed[system.location(id)->pid()] = 1;
  return committed;
}